

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_aes_encrypt.c
# Opt level: O1

int tc_aes128_set_encrypt_key(TCAesKeySched_t s,uint8_t *k)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  iVar1 = 0;
  if (k != (uint8_t *)0x0 && s != (TCAesKeySched_t)0x0) {
    lVar3 = 0;
    do {
      uVar2 = *(uint *)(k + lVar3 * 4);
      s->words[lVar3] =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    uVar2 = s->words[3];
    uVar4 = 4;
    do {
      if ((uVar4 & 3) == 0) {
        uVar2 = ((uint)sbox[uVar2 >> 0x18] |
                (uint)sbox[uVar2 & 0xff] << 8 |
                (uint)sbox[(uVar2 << 8) >> 0x10 & 0xff] << 0x10 |
                (uint)sbox[(uVar2 << 8) >> 0x18] << 0x18) ^
                *(uint *)(&DAT_00121760 + ((uint)uVar4 & 0xfffffffc));
      }
      uVar2 = uVar2 ^ s->words[uVar4 - 4];
      s->words[uVar4] = uVar2;
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x2c);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int tc_aes128_set_encrypt_key(TCAesKeySched_t s, const uint8_t *k)
{
	const unsigned int rconst[11] = {
		0x00000000, 0x01000000, 0x02000000, 0x04000000, 0x08000000, 0x10000000,
		0x20000000, 0x40000000, 0x80000000, 0x1b000000, 0x36000000
	};
	unsigned int i;
	unsigned int t;

	if (s == (TCAesKeySched_t) 0) {
		return TC_CRYPTO_FAIL;
	} else if (k == (const uint8_t *) 0) {
		return TC_CRYPTO_FAIL;
	}

	for (i = 0; i < Nk; ++i) {
		s->words[i] = (k[Nb*i]<<24) | (k[Nb*i+1]<<16) |
			      (k[Nb*i+2]<<8) | (k[Nb*i+3]);
	}

	for (; i < (Nb * (Nr + 1)); ++i) {
		t = s->words[i-1];
		if ((i % Nk) == 0) {
			t = subword(rotword(t)) ^ rconst[i/Nk];
		}
		s->words[i] = s->words[i-Nk] ^ t;
	}

	return TC_CRYPTO_SUCCESS;
}